

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::SkipUntilNewline(AsciiParser *this)

{
  bool bVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  char local_1a;
  char local_19;
  char d;
  AsciiParser *pAStack_18;
  char c;
  AsciiParser *this_local;
  
  pAStack_18 = this;
  do {
    do {
      bVar1 = Eof(this);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_00612784;
      bVar1 = Char1(this,&local_19);
      if (!bVar1) {
        return false;
      }
      if (local_19 == '\n') goto LAB_00612784;
    } while (local_19 != '\r');
    uVar2 = StreamReader::tell(this->_sr);
    uVar3 = StreamReader::size(this->_sr);
  } while (uVar3 - 1 <= uVar2);
  bVar1 = Char1(this,&local_1a);
  if (bVar1) {
    if ((local_1a == '\n') || (bVar1 = StreamReader::seek_from_current(this->_sr,-1), bVar1)) {
LAB_00612784:
      (this->_curr_cursor).row = (this->_curr_cursor).row + 1;
      (this->_curr_cursor).col = 0;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::SkipUntilNewline() {
  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      return false;
    }

    if (c == '\n') {
      break;
    } else if (c == '\r') {
      // CRLF?
      if (_sr->tell() < (_sr->size() - 1)) {
        char d;
        if (!Char1(&d)) {
          // this should not happen.
          return false;
        }

        if (d == '\n') {
          break;
        }

        // unwind 1 char
        if (!_sr->seek_from_current(-1)) {
          // this should not happen.
          return false;
        }

        break;
      }

    } else {
      // continue
    }
  }

  _curr_cursor.row++;
  _curr_cursor.col = 0;
  return true;
}